

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::Array<unsigned_char>_> * __thiscall
kj::_::NullableValue<kj::Array<unsigned_char>_>::operator=
          (NullableValue<kj::Array<unsigned_char>_> *this,
          NullableValue<kj::Array<unsigned_char>_> *other)

{
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      Array<unsigned_char>::~Array(&(this->field_1).value);
    }
    if (other->isSet == true) {
      (this->field_1).value.ptr = (other->field_1).value.ptr;
      (this->field_1).value.size_ = (other->field_1).value.size_;
      (this->field_1).value.disposer = (other->field_1).value.disposer;
      (other->field_1).value.ptr = (uchar *)0x0;
      (other->field_1).value.size_ = 0;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }